

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

void __thiscall file_base_0::test_method(file_base_0 *this)

{
  unit_test_log_t *puVar1;
  unit_test_log_t *this_00;
  const_string local_118;
  const_string local_108;
  char *local_f8;
  char *local_f0;
  const_string local_e8;
  const_string local_d8;
  char *local_c8;
  char *local_c0;
  const_string local_b8;
  const_string local_a8;
  char *local_98;
  char *local_90;
  const_string local_88;
  const_string local_78;
  char *local_68;
  char *local_60;
  unit_test_log_t local_58;
  undefined1 local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_118.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_118.m_end = "";
  local_108.m_begin = "";
  local_108.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,&local_118,10,&local_108);
  puVar1 = &local_58;
  local_50 = 0;
  local_58.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_001cf9a0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = "";
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_f0 = "";
  local_38 = "a";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char_const*,char[2]>
            (puVar1,&local_f8,10,1,2,&local_38,"ah::file_base( \"a\" )","a","\"a\"");
  local_e8.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_e8.m_end = "";
  local_d8.m_begin = "";
  local_d8.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_e8,0xb,&local_d8);
  local_50 = 0;
  local_58.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_001cf9a0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = "";
  local_c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_c0 = "";
  local_38 = "a.txt";
  puVar1 = &local_58;
  this_00 = puVar1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char_const*,char[6]>
            (puVar1,&local_c8,0xb,1,2,&local_38,"ah::file_base( \"a.txt\" )","a.txt","\"a.txt\"");
  local_b8.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_b8.m_end = "";
  local_a8.m_begin = "";
  local_a8.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(this_00,&local_b8,0xc,&local_a8);
  local_50 = 0;
  local_58.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_001cf9a0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = "";
  local_98 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_90 = "";
  local_38 = ".a.txt";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char_const*,char[7]>
            (puVar1,&local_98,0xc,1,2,&local_38,"ah::file_base( \".a.txt\" )",".a.txt","\".a.txt\"")
  ;
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_88.m_end = "";
  local_78.m_begin = "";
  local_78.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_88,0xd,&local_78);
  local_50 = 0;
  local_58.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_001cf9a0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = "";
  local_68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_60 = "";
  local_38 = "c:\\asd\\.a.txt";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char_const*,char[14]>
            (&local_58,&local_68,0xd,1,2,&local_38,"ah::file_base( \"c:\\\\asd\\\\.a.txt\" )",
             "c:\\asd\\.a.txt","\"c:\\\\asd\\\\.a.txt\"");
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( file_base_0 )
{
    BOOST_CHECK_EQUAL( ah::file_base( "a" ), "a" );
    BOOST_CHECK_EQUAL( ah::file_base( "a.txt" ), "a.txt" );
    BOOST_CHECK_EQUAL( ah::file_base( ".a.txt" ), ".a.txt" );
    BOOST_CHECK_EQUAL( ah::file_base( "c:\\asd\\.a.txt" ), "c:\\asd\\.a.txt" );
}